

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_correlation.c
# Opt level: O2

void WebRtcSpl_CrossCorrelationC
               (int32_t *cross_correlation,int16_t *seq1,int16_t *seq2,size_t dim_seq,
               size_t dim_cross_correlation,int right_shifts,int step_seq2)

{
  size_t sVar1;
  int32_t corr;
  int iVar2;
  size_t sVar3;
  
  for (sVar3 = 0; sVar3 != dim_cross_correlation; sVar3 = sVar3 + 1) {
    iVar2 = 0;
    for (sVar1 = 0; dim_seq != sVar1; sVar1 = sVar1 + 1) {
      iVar2 = iVar2 + ((int)seq2[sVar1] * (int)seq1[sVar1] >> ((byte)right_shifts & 0x1f));
    }
    *cross_correlation = iVar2;
    cross_correlation = cross_correlation + 1;
    seq2 = seq2 + step_seq2;
  }
  return;
}

Assistant:

void WebRtcSpl_CrossCorrelationC(int32_t* cross_correlation,
                                 const int16_t* seq1,
                                 const int16_t* seq2,
                                 size_t dim_seq,
                                 size_t dim_cross_correlation,
                                 int right_shifts,
                                 int step_seq2) {
  size_t i = 0, j = 0;

  for (i = 0; i < dim_cross_correlation; i++) {
    int32_t corr = 0;
    for (j = 0; j < dim_seq; j++)
      corr += (seq1[j] * seq2[j]) >> right_shifts;
    seq2 += step_seq2;
    *cross_correlation++ = corr;
  }
}